

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aiman.h
# Opt level: O3

void server::aiman::checkai(void)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  
  if (dorefresh != '\x01') {
    return;
  }
  dorefresh = 0;
  if ((gamemode < 0x17) && (0 < (long)DAT_00193844)) {
    lVar3 = 0;
    iVar4 = 0;
    do {
      lVar1 = *(long *)(clients + lVar3 * 8);
      if (*(int *)(lVar1 + 8) != -1) {
        iVar4 = iVar4 + (uint)(*(int *)(lVar1 + 0x39c) == 0);
      }
      lVar3 = lVar3 + 1;
    } while (DAT_00193844 != lVar3);
    if (iVar4 != 0) {
      checksetup();
      do {
        bVar2 = reassignai();
      } while (bVar2);
      return;
    }
  }
  clearai();
  return;
}

Assistant:

void checkai()
    {
        if(!dorefresh) return;
        dorefresh = false;
        if(m_botmode && numclients(-1, false, true))
        {
            checksetup();
            while(reassignai());
        }
        else clearai();
    }